

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreXmlSerializer.cpp
# Opt level: O2

bool Assimp::Ogre::OgreXmlSerializer::ImportSkeleton(IOSystem *pIOHandler,MeshXml *mesh)

{
  bool bVar1;
  Skeleton *this;
  XmlReaderPtr reader;
  OgreXmlSerializer serializer;
  
  if ((mesh == (MeshXml *)0x0) || ((mesh->skeletonRef)._M_string_length == 0)) {
    bVar1 = false;
  }
  else {
    std::__cxx11::string::string((string *)&serializer,".skeleton",(allocator *)&reader);
    bVar1 = EndsWith(&mesh->skeletonRef,(string *)&serializer,false);
    std::__cxx11::string::~string((string *)&serializer);
    if (bVar1) {
      bVar1 = OgreBinarySerializer::ImportSkeleton(pIOHandler,mesh);
      if (bVar1) {
        return true;
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &serializer,&mesh->skeletonRef,".xml");
      std::__cxx11::string::operator=((string *)mesh,(string *)&serializer);
      std::__cxx11::string::~string((string *)&serializer);
    }
    OpenReader((OgreXmlSerializer *)&reader,pIOHandler,&mesh->skeletonRef);
    bVar1 = reader.
            super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr != (element_type *)0x0;
    if (bVar1) {
      this = (Skeleton *)operator_new(0x38);
      Skeleton::Skeleton(this);
      serializer.m_reader =
           reader.
           super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
           ._M_ptr;
      serializer.m_currentNodeName._M_dataplus._M_p = (pointer)&serializer.m_currentNodeName.field_2
      ;
      serializer.m_currentNodeName._M_string_length = 0;
      serializer.m_currentNodeName.field_2._M_local_buf[0] = '\0';
      ReadSkeleton(&serializer,this);
      mesh->skeleton = this;
      std::__cxx11::string::~string((string *)&serializer.m_currentNodeName);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&reader.
                super___shared_ptr<irr::io::IIrrXMLReader<char,_irr::io::IXMLBase>,_(__gnu_cxx::_Lock_policy)2>
                ._M_refcount);
  }
  return bVar1;
}

Assistant:

bool OgreXmlSerializer::ImportSkeleton(Assimp::IOSystem *pIOHandler, MeshXml *mesh)
{
    if (!mesh || mesh->skeletonRef.empty())
        return false;

    // Highly unusual to see in read world cases but support
    // XML mesh referencing a binary skeleton file.
    if (EndsWith(mesh->skeletonRef, ".skeleton", false))
    {
        if (OgreBinarySerializer::ImportSkeleton(pIOHandler, mesh))
            return true;

        /** Last fallback if .skeleton failed to be read. Try reading from
            .skeleton.xml even if the XML file referenced a binary skeleton.
            @note This logic was in the previous version and I don't want to break
            old code that might depends on it. */
        mesh->skeletonRef = mesh->skeletonRef + ".xml";
    }

    XmlReaderPtr reader = OpenReader(pIOHandler, mesh->skeletonRef);
    if (!reader.get())
        return false;

    Skeleton *skeleton = new Skeleton();
    OgreXmlSerializer serializer(reader.get());
    serializer.ReadSkeleton(skeleton);
    mesh->skeleton = skeleton;
    return true;
}